

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dat.c
# Opt level: O0

uint datsiz(dattyp typ,void *val)

{
  byte *in_RSI;
  undefined4 in_EDI;
  uint local_4;
  
  switch(in_EDI) {
  case 1:
    local_4 = 4;
    break;
  case 2:
    local_4 = 2;
    break;
  case 3:
  case 7:
  case 9:
    local_4 = osrp2(in_RSI);
    break;
  default:
    local_4 = 0;
    break;
  case 5:
  case 8:
    local_4 = 0;
    break;
  case 10:
  case 0xd:
  case 0xf:
  case 0x10:
    local_4 = 2;
    break;
  case 0xb:
    local_4 = (uint)*in_RSI * 10 + 1;
    break;
  case 0x11:
    local_4 = (uint)*in_RSI * 0x10 + 1;
  }
  return local_4;
}

Assistant:

uint datsiz(dattyp typ, void *val)
{
    switch(typ)
    {
    case DAT_NUMBER:
        return(4);                /* numbers are in 4-byte lsb-first format */

    case DAT_OBJECT:
        return(2);         /* object numbers are in 2-byte lsb-first format */

    case DAT_SSTRING:
    case DAT_DSTRING:
    case DAT_LIST:
        return(osrp2((char *)val));

    case DAT_NIL:
    case DAT_TRUE:
        return(0);

    case DAT_PROPNUM:
    case DAT_SYN:
    case DAT_FNADDR:
    case DAT_REDIR:
        return(2);
        
    case DAT_TPL:
        /* template is counted array of 10-byte entries, plus length byte */
        return(1 + ((*(uchar *)val) * VOCTPLSIZ));

    case DAT_TPL2:
        return(1 + ((*(uchar *)val) * VOCTPL2SIZ));

    default:
        return(0);
    }
}